

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O0

void __thiscall rcdiscover::SocketLinux::enableBroadcastImpl(SocketLinux *this)

{
  int iVar1;
  undefined8 uVar2;
  long in_RDI;
  int unaff_retaddr;
  string *in_stack_00000008;
  SocketException *in_stack_00000010;
  int yes;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar3;
  
  uVar3 = 1;
  iVar1 = setsockopt(*(int *)(in_RDI + 0x20),1,6,&stack0xfffffffffffffff4,4);
  if (iVar1 == -1) {
    uVar2 = __cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(uVar3,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    __errno_location();
    SocketException::SocketException(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    __cxa_throw(uVar2,&SocketException::typeinfo,SocketException::~SocketException);
  }
  return;
}

Assistant:

void SocketLinux::enableBroadcastImpl()
{
  const int yes = 1;
  if (::setsockopt(sock_,
                  SOL_SOCKET,
                  SO_BROADCAST,
                  reinterpret_cast<const char *>(&yes),
                  sizeof(yes)) == -1)
  {
    throw SocketException("Error while setting socket options", errno);
  }
}